

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

bool __thiscall
booster::locale::impl_icu::calendar_impl::same(calendar_impl *this,abstract_calendar *other)

{
  char cVar1;
  Calendar *pCVar2;
  Calendar *pCVar3;
  long in_RSI;
  long in_RDI;
  calendar_impl *oc;
  long local_38;
  bool local_1;
  
  if (in_RSI == 0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(in_RSI,&abstract_calendar::typeinfo,&typeinfo,0);
  }
  if (local_38 == 0) {
    local_1 = false;
  }
  else {
    pCVar2 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50));
    pCVar3 = hold_ptr<icu_70::Calendar>::operator*((hold_ptr<icu_70::Calendar> *)(local_38 + 0x50));
    cVar1 = (**(code **)(*(long *)pCVar2 + 0x28))(pCVar2,pCVar3);
    local_1 = cVar1 != '\0';
  }
  return local_1;
}

Assistant:

virtual bool same(abstract_calendar const *other) const 
        {
            calendar_impl const *oc=dynamic_cast<calendar_impl const *>(other);
            if(!oc)
                return false;
            return calendar_->isEquivalentTo(*oc->calendar_)!=0;
        }